

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

string * __thiscall
ExpressionInternal::toString_abi_cxx11_(string *__return_storage_ptr__,ExpressionInternal *this)

{
  long *args;
  double *args_00;
  Identifier *this_00;
  StringLiteral *this_01;
  string *psVar1;
  reference pvVar2;
  pointer pEVar3;
  uint *args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator<char> local_5b1;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  allocator<char> local_19;
  ExpressionInternal *local_18;
  ExpressionInternal *this_local;
  
  args_01 = &switchD_0020179a::switchdataD_00229aac;
  local_18 = this;
  this_local = (ExpressionInternal *)__return_storage_ptr__;
  switch(this->type) {
  case Integer:
    args = valueAs<long>(this);
    tinyformat::format<long>(__return_storage_ptr__,"%d",args);
    break;
  case Float:
    args_00 = valueAs<double>(this);
    tinyformat::format<double>(__return_storage_ptr__,"%g",args_00);
    break;
  case Identifier:
    this_00 = valueAs<Identifier>(this);
    psVar1 = Identifier::string_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
    break;
  case String:
    this_01 = valueAs<StringLiteral>(this);
    psVar1 = StringLiteral::string_abi_cxx11_(this_01);
    escapeString(__return_storage_ptr__,psVar1);
    break;
  case MemoryPos:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,".",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case Add:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_50,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_70,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s + %s)",(char *)&local_50,&local_70,in_R8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case Sub:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_90,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_b0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s - %s)",(char *)&local_90,&local_b0,in_R8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  case Mult:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_d0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_f0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s * %s)",(char *)&local_d0,&local_f0,in_R8);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    break;
  case Div:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_110,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_130,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s / %s)",(char *)&local_110,&local_130,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    break;
  case Mod:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_150,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_170,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s %% %s)",(char *)&local_150,&local_170,in_R8
              );
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    break;
  case Neg:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_190,pEVar3);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(-%s)",(char *)&local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    std::__cxx11::string::~string((string *)&local_190);
    break;
  case LogNot:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_1b0,pEVar3);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(!%s)",(char *)&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    std::__cxx11::string::~string((string *)&local_1b0);
    break;
  case BitNot:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_1d0,pEVar3);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(~%s)",(char *)&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
    std::__cxx11::string::~string((string *)&local_1d0);
    break;
  case LeftShift:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_1f0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_210,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s << %s)",(char *)&local_1f0,&local_210,in_R8
              );
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    break;
  case RightShift:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_230,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_250,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >> %s)",(char *)&local_230,&local_250,in_R8
              );
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    break;
  case Less:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_270,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_290,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s < %s)",(char *)&local_270,&local_290,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    break;
  case Greater:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_2b0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_2d0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s > %s)",(char *)&local_2b0,&local_2d0,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    break;
  case LessEqual:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_2f0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_310,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s <= %s)",(char *)&local_2f0,&local_310,in_R8
              );
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    break;
  case GreaterEqual:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_330,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_350,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >= %s)",(char *)&local_330,&local_350,in_R8
              );
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    break;
  case Equal:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_370,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_390,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s == %s)",(char *)&local_370,&local_390,in_R8
              );
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    break;
  case NotEqual:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_3b0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_3d0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s != %s)",(char *)&local_3b0,&local_3d0,in_R8
              );
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3b0);
    break;
  case BitAnd:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_3f0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_410,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s & %s)",(char *)&local_3f0,&local_410,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    break;
  case Xor:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_4f0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_510,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ^ %s)",(char *)&local_4f0,&local_510,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_4f0);
    break;
  case BitOr:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_430,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_450,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s | %s)",(char *)&local_430,&local_450,in_R8)
    ;
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_430);
    break;
  case LogAnd:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_470,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_490,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s && %s)",(char *)&local_470,&local_490,in_R8
              );
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_470);
    break;
  case LogOr:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_4b0,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_4d0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s || %s)",(char *)&local_4b0,&local_4d0,in_R8
              );
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    break;
  case TertiaryIf:
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_530,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,1);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_550,pEVar3);
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,2);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_570,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ? %s : %s)",(char *)&local_530,&local_550,
               &local_570,in_R9);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_530);
    break;
  case ToString:
    convertUnicodeCharToUtf8_abi_cxx11_(&local_590,L'°');
    pvVar2 = std::
             vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
             ::operator[](&this->children,0);
    pEVar3 = std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
             operator->(pvVar2);
    toString_abi_cxx11_(&local_5b0,pEVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s%s)",(char *)&local_590,&local_5b0,in_R8);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_590);
    break;
  case FunctionCall:
    formatFunctionCall_abi_cxx11_(__return_storage_ptr__,this);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_5b1);
    std::allocator<char>::~allocator(&local_5b1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionInternal::toString()
{
	switch (type)
	{
	case OperatorType::Integer:
		return tfm::format("%d",valueAs<int64_t>());
	case OperatorType::Float:
		return tfm::format("%g",valueAs<double>());
	case OperatorType::Identifier:
		return valueAs<Identifier>().string();
	case OperatorType::String:
		return escapeString(valueAs<StringLiteral>().string());
	case OperatorType::MemoryPos:
		return ".";
	case OperatorType::Add:
		return tfm::format("(%s + %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Sub:
		return tfm::format("(%s - %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mult:
		return tfm::format("(%s * %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Div:
		return tfm::format("(%s / %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mod:
		return tfm::format("(%s %% %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Neg:
		return tfm::format("(-%s)",children[0]->toString());
	case OperatorType::LogNot:
		return tfm::format("(!%s)",children[0]->toString());
	case OperatorType::BitNot:
		return tfm::format("(~%s)",children[0]->toString());
	case OperatorType::LeftShift:
		return tfm::format("(%s << %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::RightShift:
		return tfm::format("(%s >> %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Less:
		return tfm::format("(%s < %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Greater:
		return tfm::format("(%s > %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LessEqual:
		return tfm::format("(%s <= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::GreaterEqual:
		return tfm::format("(%s >= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Equal:
		return tfm::format("(%s == %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::NotEqual:
		return tfm::format("(%s != %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitAnd:
		return tfm::format("(%s & %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitOr:
		return tfm::format("(%s | %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogAnd:
		return tfm::format("(%s && %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogOr:
		return tfm::format("(%s || %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Xor:
		return tfm::format("(%s ^ %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::TertiaryIf:
		return tfm::format("(%s ? %s : %s)",children[0]->toString(),children[1]->toString(),children[2]->toString());
	case OperatorType::ToString:
		return tfm::format("(%s%s)",convertUnicodeCharToUtf8(u'\u00B0'),children[0]->toString());
	case OperatorType::FunctionCall:
		return formatFunctionCall();
	default:
		return "";
	}
}